

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool tinyusdz::anon_unknown_160::CombinePrimSpecRec
               (uint32_t depth,PrimSpec *dst,PrimSpec *src,string *warn,string *err)

{
  string *__rhs;
  pointer pPVar1;
  pointer pPVar2;
  PrimSpec *pPVar3;
  __type _Var4;
  bool bVar5;
  ostream *poVar6;
  size_type sVar7;
  mapped_type *this;
  _Base_ptr p_Var8;
  long lVar9;
  PrimSpec *pPVar10;
  PrimSpec *dst_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long lVar11;
  PrimSpec *child;
  pointer __x;
  bool bVar12;
  ostringstream ss_e;
  ostringstream local_1a8 [376];
  
  if (depth < 0x8000001) {
    PrimMetas::update_from(&dst->_metas,&src->_metas,false);
    for (p_Var8 = (src->_props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(src->_props)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8)) {
      sVar7 = ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::count(&dst->_props,(key_type *)(p_Var8 + 1));
      if (sVar7 == 0) {
        this = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](&dst->_props,(key_type *)(p_Var8 + 1));
        Property::operator=(this,(Property *)(p_Var8 + 2));
      }
    }
    pPVar1 = (src->_children).
             super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__x = (src->_children).
               super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
               super__Vector_impl_data._M_start; bVar12 = __x == pPVar1, !bVar12; __x = __x + 1) {
      pPVar2 = (dst->_children).
               super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar3 = (dst->_children).
               super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
               super__Vector_impl_data._M_finish;
      __rhs = &__x->_name;
      lVar11 = 0;
      for (lVar9 = ((long)pPVar3 - (long)pPVar2) / 0x568 >> 2;
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&(pPVar2->_name)._M_dataplus._M_p + lVar11), 0 < lVar9; lVar9 = lVar9 + -1)
      {
        _Var4 = ::std::operator==(__lhs,__rhs);
        if (_Var4) {
          dst_00 = (PrimSpec *)((long)&pPVar2->_specifier + lVar11);
          goto LAB_0017845d;
        }
        _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&pPVar2[1]._name._M_dataplus._M_p + lVar11),__rhs);
        if (_Var4) {
          dst_00 = (PrimSpec *)((long)&pPVar2[1]._specifier + lVar11);
          goto LAB_0017845d;
        }
        _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&pPVar2[2]._name._M_dataplus._M_p + lVar11),__rhs);
        if (_Var4) {
          dst_00 = (PrimSpec *)((long)&pPVar2[2]._specifier + lVar11);
          goto LAB_0017845d;
        }
        _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&pPVar2[3]._name._M_dataplus._M_p + lVar11),__rhs);
        if (_Var4) {
          dst_00 = (PrimSpec *)((long)&pPVar2[3]._specifier + lVar11);
          goto LAB_0017845d;
        }
        lVar11 = lVar11 + 0x15a0;
      }
      lVar9 = (((long)pPVar3 - (long)pPVar2) - lVar11) / 0x568;
      pPVar10 = (PrimSpec *)((long)&pPVar2->_specifier + lVar11);
      if (lVar9 == 1) {
LAB_00178449:
        _Var4 = ::std::operator==(&pPVar10->_name,__rhs);
        dst_00 = pPVar10;
        if (!_Var4) {
          dst_00 = pPVar3;
        }
      }
      else if (lVar9 == 3) {
        _Var4 = ::std::operator==(__lhs,__rhs);
        dst_00 = pPVar10;
        if (!_Var4) {
          pPVar10 = (PrimSpec *)((long)&pPVar2[1]._specifier + lVar11);
          goto LAB_00178432;
        }
      }
      else {
        dst_00 = pPVar3;
        if (lVar9 == 2) {
LAB_00178432:
          _Var4 = ::std::operator==(&pPVar10->_name,__rhs);
          dst_00 = pPVar10;
          if (!_Var4) {
            pPVar10 = pPVar10 + 1;
            goto LAB_00178449;
          }
        }
      }
LAB_0017845d:
      if (dst_00 == (dst->_children).
                    super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::push_back
                  (&dst->_children,__x);
      }
      else {
        bVar5 = CombinePrimSpecRec(depth + 1,dst_00,__x,warn,err);
        if (!bVar5) {
          return bVar12;
        }
      }
    }
    bVar12 = true;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar6 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"CombinePrimSpecRec");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1a0);
    ::std::operator<<(poVar6," ");
    poVar6 = ::std::operator<<((ostream *)local_1a8,"PrimSpec tree too deep.");
    ::std::operator<<(poVar6,"\n");
    if (warn != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)warn);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool CombinePrimSpecRec(uint32_t depth, PrimSpec &dst, const PrimSpec &src, std::string *warn,
                      std::string *err) {
  (void)warn;

  if (depth > (1024 * 1024 * 128)) {
    PUSH_ERROR_AND_RETURN("PrimSpec tree too deep.");
  }

  // Combine metadataum
  dst.metas().update_from(src.metas(), false);

  // Combine properties
  for (const auto &prop : src.props()) {
    // add if not existent
    if (dst.props().count(prop.first) == 0) {
      dst.props()[prop.first] = prop.second;
    }
  }

  // Combine child primspecs.
  for (auto &child : src.children()) {
    auto dst_it = std::find_if(
        dst.children().begin(), dst.children().end(),
        [&child](const PrimSpec &ps) { return ps.name() == child.name(); });

    // if exists, combine properties and children
    if (dst_it != dst.children().end()) {
      if (!CombinePrimSpecRec(depth + 1, (*dst_it), child, warn, err)) {
        return false;
      }
    }
    // otherwise add it
    else {
      dst.children().push_back(child);
    }
  }

  return true;
}